

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::bt_peer_connection::write_keepalive(bt_peer_connection *this)

{
  span<const_char> local_20;
  bt_peer_connection *local_10;
  bt_peer_connection *this_local;
  
  local_10 = this;
  span<char_const>::span<char_const,4l>((span<char_const> *)&local_20,(char (*) [4])"");
  peer_connection::send_buffer(&this->super_peer_connection,local_20);
  return;
}

Assistant:

void bt_peer_connection::write_keepalive()
	{
		INVARIANT_CHECK;

		// Don't require the bitfield to have been sent at this point
		// the case where m_sent_bitfield may not be true is if the
		// torrent doesn't have any metadata, and a peer is timing out.
		// then the keep-alive message will be sent before the bitfield
		// this is a violation to the original protocol, but necessary
		// for the metadata extension.
		TORRENT_ASSERT(m_sent_handshake);

		static const char msg[] = {0,0,0,0};
		send_buffer(msg);
	}